

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  uint32_t *puVar1;
  LRUHandle *pLVar2;
  bool bVar3;
  int iVar4;
  LRUHandle **ppLVar5;
  long lVar6;
  LRUCache *this_00;
  Mutex *__mutex;
  Slice local_40;
  
  lVar6 = 0;
  do {
    __mutex = &this->shard_[lVar6].mutex_;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    this_00 = this->shard_ + lVar6;
    while (pLVar2 = (this_00->lru_).next, pLVar2 != &this_00->lru_) {
      if (pLVar2->refs != 1) {
        __assert_fail("e->refs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                      ,0x148,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
      if (pLVar2->next == pLVar2) {
        __assert_fail("next != this",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                      ,0x3b,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
      }
      local_40.data_ = pLVar2->key_data;
      local_40.size_ = pLVar2->key_length;
      ppLVar5 = HandleTable::FindPointer(&this_00->table_,&local_40,pLVar2->hash);
      pLVar2 = *ppLVar5;
      if (pLVar2 != (LRUHandle *)0x0) {
        *ppLVar5 = pLVar2->next_hash;
        puVar1 = &(this_00->table_).elems_;
        *puVar1 = *puVar1 - 1;
      }
      bVar3 = LRUCache::FinishErase(this_00,pLVar2);
      if (!bVar3) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                      ,0x14b,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }